

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O1

int __thiscall
bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
          (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  buf_type *pbVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = (*(int *)(dst + 0xc) - *(int *)(dst + 0x10)) + (*(uint *)(dst + 8) & 0x7fffffff);
  if (iVar3 == 0) {
    (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ =
         (buf_type *)0x0;
    *(undefined4 *)
     &(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8 = 0
    ;
  }
  else {
    uVar4 = iVar3 + 0xf;
    pbVar1 = (buf_type *)operator_new((ulong)(uVar4 & 0xfffffff0));
    (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ = pbVar1;
    *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              field_0x8 = uVar4 & 0x7ffffff0 | 0x80000000;
  }
  (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_ =
       *(size_type *)(dst + 0xc);
  (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ =
       (*(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                  field_0x8 & 0x7fffffff) -
       ((*(uint *)(dst + 8) & 0x7fffffff) - *(int *)(dst + 0x10) & 0xfffffff0);
  if ((*(uint *)(dst + 0xc) == 0) && (*(uint *)(dst + 0x10) == (*(uint *)(dst + 8) & 0x7fffffff))) {
    return *(uint *)(dst + 8) & 0x7fffffff;
  }
  memcpy((this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_,
         *(void **)dst,(ulong)(*(uint *)(dst + 0xc) & 0xfffffff8));
  pvVar2 = memcpy((this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                  buf_ + (this->super_type).
                         super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_,
                  (void *)((ulong)*(uint *)(dst + 0x10) + *(long *)dst),
                  (ulong)((*(uint *)(dst + 8) & 0x7fffffff) - *(uint *)(dst + 0x10) & 0xfffffff0));
  return (int)pvVar2;
}

Assistant:

void left_right_sequence<L, R, i>::copy(const left_right_sequence& other) {
	size_type os = other.raw_size();
	if ( os <= base_type::inline_raw_cap ) {
		this->buf_ = this->extra();
		this->cap_ = base_type::inline_raw_cap;
		this->free_= 0;
	}
	else {
		os         = ((os + (base_type::block_size-1)) / base_type::block_size) * base_type::block_size;
		this->buf_ = (buf_type*)::operator new(os*sizeof(buf_type));
		this->cap_ = os;
		this->free_= 1;
	}
	this->left_ = other.left_;
	this->right_= this->cap_ - (other.right_size()*sizeof(right_type));
	if (!other.empty()) {
		std::memcpy(this->begin(), other.begin(), other.left_size()*sizeof(left_type));
		std::memcpy(this->right(), const_cast<left_right_sequence&>(other).right(), other.right_size()*sizeof(right_type));
	}
}